

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_scandir_non_existent_dir(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_dirent_t dent;
  uv_fs_t req;
  uv_dirent_t uStack_1d8;
  uv_fs_t local_1c8;
  
  loop = uv_default_loop();
  uv_fs_rmdir((uv_loop_t *)0x0,&local_1c8,"./non_existent_dir/",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&local_1c8);
  memset(&local_1c8,0xdb,0x1b8);
  iVar1 = uv_fs_scandir((uv_loop_t *)0x0,&local_1c8,"./non_existent_dir/",0,(uv_fs_cb)0x0);
  if (iVar1 == -2) {
    if (local_1c8.result == -2) {
      if (local_1c8.ptr == (void *)0x0) {
        iVar1 = uv_fs_scandir_next(&local_1c8,&uStack_1d8);
        if (iVar1 == -2) {
          uv_fs_req_cleanup(&local_1c8);
          iVar1 = uv_fs_scandir(loop,&scandir_req,"./non_existent_dir/",0,non_existent_scandir_cb);
          if (iVar1 == 0) {
            if (scandir_cb_count == 0) {
              uv_run(loop,UV_RUN_DEFAULT);
              if (scandir_cb_count == 1) {
                puVar2 = uv_default_loop();
                close_loop(puVar2);
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_close(puVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                uVar3 = 0xa7d;
              }
              else {
                pcVar4 = "scandir_cb_count == 1";
                uVar3 = 0xa7b;
              }
            }
            else {
              pcVar4 = "scandir_cb_count == 0";
              uVar3 = 0xa79;
            }
          }
          else {
            pcVar4 = "r == 0";
            uVar3 = 0xa77;
          }
        }
        else {
          pcVar4 = "UV_ENOENT == uv_fs_scandir_next(&req, &dent)";
          uVar3 = 0xa73;
        }
      }
      else {
        pcVar4 = "req.ptr == NULL";
        uVar3 = 0xa72;
      }
    }
    else {
      pcVar4 = "req.result == UV_ENOENT";
      uVar3 = 0xa71;
    }
  }
  else {
    pcVar4 = "r == UV_ENOENT";
    uVar3 = 0xa70;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_scandir_non_existent_dir) {
  const char* path;
  uv_fs_t req;
  uv_dirent_t dent;
  int r;

  path = "./non_existent_dir/";
  loop = uv_default_loop();

  uv_fs_rmdir(NULL, &req, path, NULL);
  uv_fs_req_cleanup(&req);

  /* Fill the req to ensure that required fields are cleaned up */
  memset(&req, 0xdb, sizeof(req));

  r = uv_fs_scandir(NULL, &req, path, 0, NULL);
  ASSERT(r == UV_ENOENT);
  ASSERT(req.result == UV_ENOENT);
  ASSERT(req.ptr == NULL);
  ASSERT(UV_ENOENT == uv_fs_scandir_next(&req, &dent));
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, non_existent_scandir_cb);
  ASSERT(r == 0);

  ASSERT(scandir_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(scandir_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}